

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Log::backward_impl
          (Log *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  uint uVar11;
  Index size;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  ulong uVar12;
  
  uVar12 = (ulong)(dEdf->d).nd;
  iVar13 = 1;
  iVar10 = 1;
  if (uVar12 != 0) {
    uVar15 = 0;
    do {
      iVar10 = iVar10 * (dEdf->d).d[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  pTVar3 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(pTVar3->d).nd;
  if (uVar12 != 0) {
    iVar13 = 1;
    uVar15 = 0;
    do {
      iVar13 = iVar13 * (pTVar3->d).d[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  uVar14 = iVar13 * (pTVar3->d).bd;
  if (iVar10 * (dEdf->d).bd == uVar14) {
    uVar12 = (ulong)(dEdxi->d).nd;
    iVar10 = 1;
    if (uVar12 != 0) {
      uVar15 = 0;
      do {
        iVar10 = iVar10 * (dEdxi->d).d[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    uVar11 = iVar10 * (dEdxi->d).bd;
    uVar12 = (ulong)uVar11;
    if (uVar11 == uVar14) {
      pfVar4 = dEdxi->v;
      uVar15 = uVar12;
      if ((((ulong)pfVar4 & 3) == 0) &&
         (uVar15 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 3), uVar12 <= uVar15)) {
        uVar15 = uVar12;
      }
      pfVar5 = dEdf->v;
      pfVar6 = pTVar3->v;
      uVar17 = uVar12 - uVar15;
      uVar16 = uVar17 + 3;
      if (-1 < (long)uVar17) {
        uVar16 = uVar17;
      }
      if (uVar15 != 0) {
        uVar18 = 0;
        do {
          pfVar4[uVar18] = pfVar5[uVar18] / pfVar6[uVar18] + pfVar4[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      uVar16 = (uVar16 & 0xfffffffffffffffc) + uVar15;
      if (3 < (long)uVar17) {
        do {
          auVar19 = divps(*(undefined1 (*) [16])(pfVar5 + uVar15),
                          *(undefined1 (*) [16])(pfVar6 + uVar15));
          pfVar1 = pfVar4 + uVar15;
          fVar7 = pfVar1[1];
          fVar8 = pfVar1[2];
          fVar9 = pfVar1[3];
          pfVar2 = pfVar4 + uVar15;
          *pfVar2 = auVar19._0_4_ + *pfVar1;
          pfVar2[1] = auVar19._4_4_ + fVar7;
          pfVar2[2] = auVar19._8_4_ + fVar8;
          pfVar2[3] = auVar19._12_4_ + fVar9;
          uVar15 = uVar15 + 4;
        } while ((long)uVar15 < (long)uVar16);
      }
      if ((long)uVar16 < (long)uVar12) {
        do {
          pfVar4[uVar16] = pfVar5[uVar16] / pfVar6[uVar16] + pfVar4[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar12 != uVar16);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Log::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vlog_backward(fx.d.size(), xs[0]->v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += dEdf.vec().cwiseQuotient(xs[0]->vec());
#endif
}